

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gop_structure.c
# Opt level: O1

void set_multi_layer_params_for_fp
               (TWO_PASS *twopass,TWO_PASS_FRAME *twopass_frame,GF_GROUP *gf_group,
               PRIMARY_RATE_CONTROL *p_rc,RATE_CONTROL *rc,FRAME_INFO *frame_info,int start,int end,
               int *cur_frame_idx,int *frame_ind,int *parallel_frame_count,int max_parallel_frames,
               int do_frame_parallel_encode,int *first_frame_index,int depth_thr,int *cur_disp_idx,
               int layer_depth)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int *cur_disp_idx_00;
  long lVar7;
  int i_1;
  int iVar8;
  int i;
  long lVar9;
  int *piVar10;
  uint uVar11;
  FRAME_INFO *frame_info_00;
  undefined4 in_stack_00000014;
  undefined4 in_stack_0000003c;
  undefined4 in_stack_0000004c;
  int local_98 [4];
  uint local_88;
  int local_84;
  int local_80 [10];
  uint local_58 [6];
  ulong local_40;
  int (*local_38) [8];
  
  frame_info_00 = (FRAME_INFO *)((ulong)frame_info & 0xffffffff);
  piVar10 = (int *)CONCAT44(in_stack_00000014,end);
  while( true ) {
    cur_disp_idx_00 = (int *)(ulong)((int)cur_disp_idx + 1);
    uVar11 = (uint)frame_info_00;
    if ((gf_group->max_layer_depth_allowed < (int)cur_disp_idx) || ((int)(start - uVar11) < 3)) {
      iVar5 = start - uVar11;
      if (iVar5 != 0 && (int)uVar11 <= start) {
        do {
          gf_group->update_type[*cur_frame_idx] = '\x01';
          gf_group->arf_src_offset[*cur_frame_idx] = '\0';
          gf_group->cur_frame_idx[*cur_frame_idx] = (uchar)*piVar10;
          gf_group->layer_depth[*cur_frame_idx] = 6;
          gf_group->frame_type[*cur_frame_idx] = '\x01';
          gf_group->refbuf_state[*cur_frame_idx] = '\x01';
          iVar8 = gf_group->max_layer_depth;
          if (gf_group->max_layer_depth <= (int)cur_disp_idx) {
            iVar8 = (int)cur_disp_idx;
          }
          gf_group->max_layer_depth = iVar8;
          piVar10 = (int *)CONCAT44(in_stack_0000004c,depth_thr);
          gf_group->display_idx[*cur_frame_idx] = *piVar10;
          iVar8 = av1_calc_arf_boost(twopass,twopass_frame,p_rc,(FRAME_INFO *)rc,(int)frame_info_00,
                                     iVar5,0,(int *)0x0,(int *)0x0,0);
          gf_group->arf_boost[*cur_frame_idx] = iVar8;
          *piVar10 = *piVar10 + 1;
          if (max_parallel_frames != 0) {
            gf_group->frame_parallel_level[*cur_frame_idx] = (1 < *frame_ind) + 1;
            iVar8 = *frame_ind + 1;
            if ((int)parallel_frame_count <= *frame_ind) {
              iVar8 = 1;
            }
            *frame_ind = iVar8;
            gf_group->is_frame_non_ref[*cur_frame_idx] = true;
          }
          iVar8 = *cur_frame_idx;
          piVar10 = (int *)CONCAT44(in_stack_00000014,end);
          if (0 < gf_group->frame_parallel_level[iVar8]) {
            iVar6 = *piVar10;
            if (gf_group->frame_parallel_level[iVar8] == 1) {
              *(int *)CONCAT44(in_stack_0000003c,do_frame_parallel_encode) = iVar6;
            }
            gf_group->src_offset[iVar8] =
                 (iVar6 + (uint)gf_group->arf_src_offset[iVar8]) -
                 *(int *)CONCAT44(in_stack_0000003c,do_frame_parallel_encode);
          }
          *cur_frame_idx = *cur_frame_idx + 1;
          *piVar10 = *piVar10 + 1;
          frame_info_00 = (FRAME_INFO *)(ulong)((int)frame_info_00 + 1);
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
      return;
    }
    iVar8 = (int)(((uVar11 + start) - ((int)(uVar11 + start + -1) >> 0x1f)) + -1) >> 1;
    gf_group->update_type[*cur_frame_idx] = '\x06';
    gf_group->arf_src_offset[*cur_frame_idx] = (uchar)(iVar8 - uVar11);
    gf_group->cur_frame_idx[*cur_frame_idx] = (uchar)*piVar10;
    gf_group->layer_depth[*cur_frame_idx] = (int)cur_disp_idx;
    gf_group->frame_type[*cur_frame_idx] = '\x01';
    gf_group->refbuf_state[*cur_frame_idx] = '\x01';
    gf_group->display_idx[*cur_frame_idx] =
         (uint)gf_group->arf_src_offset[*cur_frame_idx] +
         *(int *)CONCAT44(in_stack_0000004c,depth_thr);
    iVar5 = av1_calc_arf_boost(twopass,twopass_frame,p_rc,(FRAME_INFO *)rc,iVar8,start - iVar8,
                               iVar8 - uVar11,(int *)0x0,(int *)0x0,0);
    gf_group->arf_boost[*cur_frame_idx] = iVar5;
    if ((max_parallel_frames != 0) && (*frame_ind <= (int)parallel_frame_count && 1 < *frame_ind)) {
      if (gf_group->arf_src_offset[*cur_frame_idx] < 7) {
        gf_group->frame_parallel_level[*cur_frame_idx] = 2;
      }
      *frame_ind = 1;
    }
    iVar5 = *cur_frame_idx;
    piVar10 = (int *)CONCAT44(in_stack_00000014,end);
    if (0 < gf_group->frame_parallel_level[iVar5]) {
      iVar6 = *piVar10;
      if (gf_group->frame_parallel_level[iVar5] == 1) {
        *(int *)CONCAT44(in_stack_0000003c,do_frame_parallel_encode) = iVar6;
      }
      gf_group->src_offset[iVar5] =
           (iVar6 + (uint)gf_group->arf_src_offset[iVar5]) -
           *(int *)CONCAT44(in_stack_0000003c,do_frame_parallel_encode);
    }
    *cur_frame_idx = *cur_frame_idx + 1;
    if ((int)first_frame_index <= (int)cur_disp_idx) break;
    piVar3 = (int *)CONCAT44(in_stack_0000004c,depth_thr);
    set_multi_layer_params_for_fp
              (twopass,twopass_frame,gf_group,p_rc,rc,frame_info_00,iVar8,end,cur_frame_idx,
               frame_ind,(int *)((ulong)parallel_frame_count & 0xffffffff),max_parallel_frames,
               do_frame_parallel_encode,(int *)((ulong)first_frame_index & 0xffffffff),depth_thr,
               cur_disp_idx_00,(int)cur_disp_idx_00);
    piVar10 = (int *)CONCAT44(in_stack_00000014,end);
    gf_group->update_type[*cur_frame_idx] = '\x05';
    gf_group->arf_src_offset[*cur_frame_idx] = '\0';
    gf_group->cur_frame_idx[*cur_frame_idx] = (uchar)*piVar10;
    gf_group->layer_depth[*cur_frame_idx] = (int)cur_disp_idx;
    gf_group->frame_type[*cur_frame_idx] = '\x01';
    gf_group->refbuf_state[*cur_frame_idx] = '\x01';
    gf_group->display_idx[*cur_frame_idx] = *piVar3;
    *piVar3 = *piVar3 + 1;
    iVar5 = *cur_frame_idx;
    if (0 < gf_group->frame_parallel_level[iVar5]) {
      iVar6 = *piVar10;
      if (gf_group->frame_parallel_level[iVar5] == 1) {
        *(int *)CONCAT44(in_stack_0000003c,do_frame_parallel_encode) = iVar6;
      }
      gf_group->src_offset[iVar5] =
           (iVar6 + (uint)gf_group->arf_src_offset[iVar5]) -
           *(int *)CONCAT44(in_stack_0000003c,do_frame_parallel_encode);
    }
    *cur_frame_idx = *cur_frame_idx + 1;
    *piVar10 = *piVar10 + 1;
    cur_disp_idx._0_4_ = (int)cur_disp_idx_00;
    frame_info_00 = (FRAME_INFO *)(ulong)(iVar8 + 1);
  }
  local_88 = (int)(((uVar11 + iVar8) - ((int)(uVar11 + iVar8 + -1) >> 0x1f)) + -1) >> 1;
  local_40 = (ulong)local_88;
  iVar5 = (start + iVar8 + 1) / 2;
  local_80[0] = local_88 - uVar11;
  local_80[1] = iVar5 - uVar11;
  local_84 = iVar5;
  local_98[2] = iVar8 - local_88;
  local_98[3] = start - iVar5;
  local_98[0] = local_88 - uVar11;
  local_98[1] = iVar5 - (iVar8 + 1);
  local_38 = gf_group->skip_frame_refresh;
  lVar9 = 0;
  do {
    iVar4 = local_80[lVar9];
    iVar6 = local_98[lVar9 + 4];
    iVar1 = local_98[lVar9 + 2];
    iVar2 = local_98[lVar9];
    gf_group->update_type[*cur_frame_idx] = '\x06';
    gf_group->arf_src_offset[*cur_frame_idx] = (uchar)iVar4;
    gf_group->cur_frame_idx[*cur_frame_idx] = (uchar)*piVar10;
    gf_group->layer_depth[*cur_frame_idx] = (int)cur_disp_idx_00;
    gf_group->frame_type[*cur_frame_idx] = '\x01';
    gf_group->refbuf_state[*cur_frame_idx] = '\x01';
    gf_group->display_idx[*cur_frame_idx] =
         (uint)gf_group->arf_src_offset[*cur_frame_idx] +
         *(int *)CONCAT44(in_stack_0000004c,depth_thr);
    iVar6 = av1_calc_arf_boost(twopass,twopass_frame,p_rc,(FRAME_INFO *)rc,iVar6,iVar1,iVar2,
                               (int *)0x0,(int *)0x0,0);
    gf_group->arf_boost[*cur_frame_idx] = iVar6;
    iVar6 = (int)cur_disp_idx_00;
    if (max_parallel_frames != 0) {
      if ((int)first_frame_index != 0x7fffffff) {
        lVar7 = (long)*cur_frame_idx;
        if (gf_group->layer_depth[lVar7 + -1] == iVar6) {
          gf_group->frame_parallel_level[lVar7] = 2;
          local_38[*cur_frame_idx][0] = gf_group->display_idx[(long)*cur_frame_idx + -1];
          local_38[*cur_frame_idx][1] = gf_group->display_idx[(long)*cur_frame_idx + -2];
          gf_group->skip_frame_as_ref[*cur_frame_idx] =
               gf_group->display_idx[(long)*cur_frame_idx + -1];
        }
        else {
          gf_group->frame_parallel_level[lVar7] = 1;
        }
      }
      if (*frame_ind <= (int)parallel_frame_count && 1 < *frame_ind) {
        if (gf_group->arf_src_offset[*cur_frame_idx] < 7) {
          gf_group->frame_parallel_level[*cur_frame_idx] = 2;
        }
        *frame_ind = 1;
      }
    }
    iVar1 = *cur_frame_idx;
    piVar10 = (int *)CONCAT44(in_stack_00000014,end);
    if (0 < gf_group->frame_parallel_level[iVar1]) {
      iVar2 = *piVar10;
      if (gf_group->frame_parallel_level[iVar1] == 1) {
        *(int *)CONCAT44(in_stack_0000003c,do_frame_parallel_encode) = iVar2;
      }
      gf_group->src_offset[iVar1] =
           (iVar2 + (uint)gf_group->arf_src_offset[iVar1]) -
           *(int *)CONCAT44(in_stack_0000003c,do_frame_parallel_encode);
    }
    *cur_frame_idx = *cur_frame_idx + 1;
    lVar9 = lVar9 + 1;
  } while (lVar9 == 1);
  local_58[0] = uVar11;
  local_58[1] = (int)local_40 + 1;
  local_58[2] = iVar8 + 1;
  local_58[3] = start + -1;
  local_80[6] = (int)local_40;
  local_80[7] = iVar8;
  local_80[8] = iVar5;
  local_80[9] = start;
  local_80[2] = iVar6;
  local_80[3] = (int)cur_disp_idx;
  local_80[4] = iVar6;
  local_80[5] = 0xffffffff;
  lVar9 = 0;
  do {
    set_multi_layer_params_for_fp
              (twopass,twopass_frame,gf_group,p_rc,rc,(FRAME_INFO *)(ulong)local_58[lVar9],
               local_80[lVar9 + 6],(int)piVar10,cur_frame_idx,frame_ind,
               (int *)((ulong)parallel_frame_count & 0xffffffff),max_parallel_frames,
               do_frame_parallel_encode,(int *)((ulong)first_frame_index & 0xffffffff),depth_thr,
               (int *)(ulong)(iVar6 + 1),(int)cur_disp_idx_00);
    piVar10 = (int *)CONCAT44(in_stack_00000014,end);
    iVar5 = local_80[lVar9 + 2];
    if (iVar5 != -1) {
      gf_group->update_type[*cur_frame_idx] = '\x05';
      gf_group->arf_src_offset[*cur_frame_idx] = '\0';
      gf_group->cur_frame_idx[*cur_frame_idx] = (uchar)*piVar10;
      gf_group->layer_depth[*cur_frame_idx] = iVar5;
      gf_group->frame_type[*cur_frame_idx] = '\x01';
      gf_group->refbuf_state[*cur_frame_idx] = '\x01';
      piVar3 = (int *)CONCAT44(in_stack_0000004c,depth_thr);
      gf_group->display_idx[*cur_frame_idx] = *piVar3;
      *piVar3 = *piVar3 + 1;
      iVar5 = *cur_frame_idx;
      if (0 < gf_group->frame_parallel_level[iVar5]) {
        iVar8 = *piVar10;
        if (gf_group->frame_parallel_level[iVar5] == 1) {
          *(int *)CONCAT44(in_stack_0000003c,do_frame_parallel_encode) = iVar8;
        }
        gf_group->src_offset[iVar5] =
             (iVar8 + (uint)gf_group->arf_src_offset[iVar5]) -
             *(int *)CONCAT44(in_stack_0000003c,do_frame_parallel_encode);
      }
      *cur_frame_idx = *cur_frame_idx + 1;
      *piVar10 = *piVar10 + 1;
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  return;
}

Assistant:

static void set_multi_layer_params_for_fp(
    const TWO_PASS *twopass, const TWO_PASS_FRAME *twopass_frame,
    GF_GROUP *const gf_group, const PRIMARY_RATE_CONTROL *p_rc,
    RATE_CONTROL *rc, FRAME_INFO *frame_info, int start, int end,
    int *cur_frame_idx, int *frame_ind, int *parallel_frame_count,
    int max_parallel_frames, int do_frame_parallel_encode,
    int *first_frame_index, int depth_thr, int *cur_disp_idx, int layer_depth) {
  const int num_frames_to_process = end - start;

  // Either we are at the last level of the pyramid, or we don't have enough
  // frames between 'l' and 'r' to create one more level.
  if (layer_depth > gf_group->max_layer_depth_allowed ||
      num_frames_to_process < 3) {
    // Leaf nodes.
    while (start < end) {
      set_params_for_leaf_frames(twopass, twopass_frame, p_rc, frame_info,
                                 gf_group, cur_frame_idx, frame_ind,
                                 parallel_frame_count, max_parallel_frames,
                                 do_frame_parallel_encode, first_frame_index,
                                 cur_disp_idx, layer_depth, start, end);
      ++start;
    }
  } else {
    const int m = (start + end - 1) / 2;

    // Internal ARF.
    int arf_src_offset = m - start;
    set_params_for_internal_arfs(
        twopass, twopass_frame, p_rc, frame_info, gf_group, cur_frame_idx,
        frame_ind, parallel_frame_count, max_parallel_frames,
        do_frame_parallel_encode, first_frame_index, INT_MAX, cur_disp_idx,
        layer_depth, arf_src_offset, m, end - m, m - start);

    // If encode reordering is enabled, configure the multi-layers accordingly
    // and return. For e.g., the encode order for gf-interval 16 after
    // reordering would be 0-> 16-> 8-> 4-> 2-> 6-> 1-> 3-> 5-> 7-> 12-> 10->
    // 14-> 9-> 11-> 13-> 15.
    if (layer_depth >= depth_thr) {
      int m1 = (m + start - 1) / 2;
      int m2 = (m + 1 + end) / 2;
      int arf_src_offsets[2] = { m1 - start, m2 - start };
      // Parameters to compute arf_boost.
      int offset[2] = { m1, m2 };
      int f_frames[2] = { m - m1, end - m2 };
      int b_frames[2] = { m1 - start, m2 - (m + 1) };

      // Set GF_GROUP params for INTNL_ARF_UPDATE frames which are reordered.
      for (int i = 0; i < 2; i++) {
        set_params_for_internal_arfs(
            twopass, twopass_frame, p_rc, frame_info, gf_group, cur_frame_idx,
            frame_ind, parallel_frame_count, max_parallel_frames,
            do_frame_parallel_encode, first_frame_index, depth_thr,
            cur_disp_idx, layer_depth + 1, arf_src_offsets[i], offset[i],
            f_frames[i], b_frames[i]);
      }

      // Initialize the start and end indices to configure LF_UPDATE frames.
      int start_idx[4] = { start, m1 + 1, m + 1, end - 1 };
      int end_idx[4] = { m1, m, m2, end };
      int layer_depth_for_intnl_overlay[4] = { layer_depth + 1, layer_depth,
                                               layer_depth + 1, INVALID_IDX };

      // Set GF_GROUP params for the rest of LF_UPDATE and INTNL_OVERLAY_UPDATE
      // frames after reordering.
      for (int i = 0; i < 4; i++) {
        set_multi_layer_params_for_fp(
            twopass, twopass_frame, gf_group, p_rc, rc, frame_info,
            start_idx[i], end_idx[i], cur_frame_idx, frame_ind,
            parallel_frame_count, max_parallel_frames, do_frame_parallel_encode,
            first_frame_index, depth_thr, cur_disp_idx, layer_depth + 2);
        if (layer_depth_for_intnl_overlay[i] != INVALID_IDX)
          set_params_for_intnl_overlay_frames(
              gf_group, cur_frame_idx, frame_ind, first_frame_index,
              cur_disp_idx, layer_depth_for_intnl_overlay[i]);
      }
      return;
    }

    // Frames displayed before this internal ARF.
    set_multi_layer_params_for_fp(
        twopass, twopass_frame, gf_group, p_rc, rc, frame_info, start, m,
        cur_frame_idx, frame_ind, parallel_frame_count, max_parallel_frames,
        do_frame_parallel_encode, first_frame_index, depth_thr, cur_disp_idx,
        layer_depth + 1);

    // Overlay for internal ARF.
    set_params_for_intnl_overlay_frames(gf_group, cur_frame_idx, frame_ind,
                                        first_frame_index, cur_disp_idx,
                                        layer_depth);

    // Frames displayed after this internal ARF.
    set_multi_layer_params_for_fp(
        twopass, twopass_frame, gf_group, p_rc, rc, frame_info, m + 1, end,
        cur_frame_idx, frame_ind, parallel_frame_count, max_parallel_frames,
        do_frame_parallel_encode, first_frame_index, depth_thr, cur_disp_idx,
        layer_depth + 1);
  }
}